

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromString
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,gcstring *XMLData)

{
  ExceptionReporter<GenICam_3_4::RuntimeException> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  gcstring *DeviceName;
  INodeMap *pNodeMap_00;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this_01;
  long *in_RSI;
  long in_RDI;
  INodeMap *pNodeMap;
  CNodeMapFactory nodeMapData;
  int *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  int SourceLine;
  char *in_stack_fffffffffffffef8;
  ExceptionReporter<GenICam_3_4::RuntimeException> *in_stack_ffffffffffffff00;
  CNodeMapFactory *pCVar3;
  CNodeMapFactory local_d8 [19];
  undefined1 local_c5;
  char local_b8 [168];
  long *local_10;
  
  SourceLine = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  if (*(long *)(in_RDI + 8) != 0) {
    local_c5 = 1;
    this_00 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,SourceLine,
               in_stack_fffffffffffffee8);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (this_00,local_b8,"Node map already created");
    local_c5 = 0;
    __cxa_throw(this_00,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::RuntimeException::~RuntimeException);
  }
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RSI + 0x48))();
  uVar2 = (**(code **)(*local_10 + 0x88))();
  pCVar3 = local_d8;
  GenApi_3_4::CNodeMapFactory::CNodeMapFactory(pCVar3,0,uVar1,uVar2,0);
  DeviceName = (gcstring *)
               GenApi_3_4::CNodeMapFactory::CreateNodeMap
                         ((gcstring *)pCVar3,(bool)((char)in_RDI + '\x10'));
  pNodeMap_00 = (INodeMap *)(in_RDI + 0x10);
  this_01 = (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)operator_new(4);
  *(undefined4 *)&(this_01->super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams = 0;
  Attach(this_01,pNodeMap_00,DeviceName,in_stack_fffffffffffffed8);
  GenApi_3_4::CNodeMapFactory::~CNodeMapFactory(local_d8);
  return;
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_LoadXMLFromString(const GENICAM_NAMESPACE::gcstring& XMLData)
    {
        // Load the DLL
        if(_Ptr)
            throw RUNTIME_EXCEPTION("Node map already created");

        // Load the XML file
        CNodeMapFactory nodeMapData(ContentType_Xml, XMLData.c_str(), XMLData.size()); //avoid string copy

        // First create node map then the reference counter. This prevents a leak in case of bad node map
        INodeMap* pNodeMap = nodeMapData.CreateNodeMap(_DeviceName);
        Attach( pNodeMap, _DeviceName, new int( 0 ) );
    }